

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa_array.c
# Opt level: O0

void test_find_element(void)

{
  aspa_status aVar1;
  aspa_record *paVar2;
  long in_FS_OFFSET;
  undefined1 local_d0 [8];
  aspa_record record_5;
  aspa_record record_4;
  aspa_record record_3;
  aspa_record record_2;
  aspa_record record_1;
  aspa_array *array;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  aVar1 = aspa_array_create((aspa_array **)&record_1.provider_asns);
  if (aVar1 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_create(&array) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xab,"void test_find_element(void)");
  }
  record_2.provider_asns._0_4_ = 1;
  record_1.customer_asn = 3;
  record_1._4_4_ = 0;
  local_1c = 300;
  local_18 = 0x12d;
  local_14 = 0x12e;
  record_1.provider_count = (size_t)&local_1c;
  aVar1 = aspa_array_insert((aspa_array *)record_1.provider_asns,0,
                            (aspa_record *)&record_2.provider_asns,true);
  if (aVar1 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 0, &record_1, true) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xaf,"void test_find_element(void)");
  }
  record_3.provider_asns._0_4_ = 2;
  record_2.customer_asn = 3;
  record_2._4_4_ = 0;
  local_28 = 400;
  local_24 = 0x191;
  local_20 = 0x192;
  record_2.provider_count = (size_t)&local_28;
  aVar1 = aspa_array_insert((aspa_array *)record_1.provider_asns,1,
                            (aspa_record *)&record_3.provider_asns,true);
  if (aVar1 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 1, &record_2, true) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xb3,"void test_find_element(void)");
  }
  record_4.provider_asns._0_4_ = 3;
  record_3.customer_asn = 3;
  record_3._4_4_ = 0;
  local_34 = 500;
  local_30 = 0x1f5;
  local_2c = 0x1f6;
  record_3.provider_count = (size_t)&local_34;
  aVar1 = aspa_array_insert((aspa_array *)record_1.provider_asns,2,
                            (aspa_record *)&record_4.provider_asns,true);
  if (aVar1 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 2, &record_3, true) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xb7,"void test_find_element(void)");
  }
  record_5.provider_asns._0_4_ = 4;
  record_4.customer_asn = 3;
  record_4._4_4_ = 0;
  local_40 = 600;
  local_3c = 0x259;
  local_38 = 0x25a;
  record_4.provider_count = (size_t)&local_40;
  aVar1 = aspa_array_insert((aspa_array *)record_1.provider_asns,3,
                            (aspa_record *)&record_5.provider_asns,true);
  if (aVar1 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 3, &record_4, true) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xbb,"void test_find_element(void)");
  }
  local_d0._0_4_ = 5;
  record_5.customer_asn = 3;
  record_5._4_4_ = 0;
  array._4_4_ = 700;
  local_48 = 0x2bd;
  local_44 = 0x2be;
  record_5.provider_count = (long)&array + 4;
  aVar1 = aspa_array_insert((aspa_array *)record_1.provider_asns,4,(aspa_record *)local_d0,true);
  if (aVar1 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 4, &record_5, true) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xbf,"void test_find_element(void)");
  }
  paVar2 = aspa_array_search((aspa_array *)record_1.provider_asns,1);
  if (paVar2 != *(aspa_record **)(record_1.provider_asns + 4)) {
    __assert_fail("aspa_array_search(array, 1) == &array->data[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0xc1,"void test_find_element(void)");
  }
  paVar2 = aspa_array_search((aspa_array *)record_1.provider_asns,2);
  if (paVar2 == (aspa_record *)(*(long *)(record_1.provider_asns + 4) + 0x18)) {
    paVar2 = aspa_array_search((aspa_array *)record_1.provider_asns,3);
    if (paVar2 != (aspa_record *)(*(long *)(record_1.provider_asns + 4) + 0x30)) {
      __assert_fail("aspa_array_search(array, 3) == &array->data[2]",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                    ,0xc3,"void test_find_element(void)");
    }
    paVar2 = aspa_array_search((aspa_array *)record_1.provider_asns,4);
    if (paVar2 != (aspa_record *)(*(long *)(record_1.provider_asns + 4) + 0x48)) {
      __assert_fail("aspa_array_search(array, 4) == &array->data[3]",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                    ,0xc4,"void test_find_element(void)");
    }
    paVar2 = aspa_array_search((aspa_array *)record_1.provider_asns,5);
    if (paVar2 != (aspa_record *)(*(long *)(record_1.provider_asns + 4) + 0x60)) {
      __assert_fail("aspa_array_search(array, 5) == &array->data[4]",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                    ,0xc5,"void test_find_element(void)");
    }
    aspa_array_free((aspa_array *)record_1.provider_asns,true);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("aspa_array_search(array, 2) == &array->data[1]",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                ,0xc2,"void test_find_element(void)");
}

Assistant:

static void test_find_element(void)
{
	struct aspa_array *array;

	assert(aspa_array_create(&array) == 0);

	struct aspa_record record_1 = RECORD(1, SEEDED_ASNS(300));

	assert(aspa_array_insert(array, 0, &record_1, true) == 0);

	struct aspa_record record_2 = RECORD(2, SEEDED_ASNS(400));

	assert(aspa_array_insert(array, 1, &record_2, true) == 0);

	struct aspa_record record_3 = RECORD(3, SEEDED_ASNS(500));

	assert(aspa_array_insert(array, 2, &record_3, true) == 0);

	struct aspa_record record_4 = RECORD(4, SEEDED_ASNS(600));

	assert(aspa_array_insert(array, 3, &record_4, true) == 0);

	struct aspa_record record_5 = RECORD(5, SEEDED_ASNS(700));

	assert(aspa_array_insert(array, 4, &record_5, true) == 0);

	assert(aspa_array_search(array, 1) == &array->data[0]);
	assert(aspa_array_search(array, 2) == &array->data[1]);
	assert(aspa_array_search(array, 3) == &array->data[2]);
	assert(aspa_array_search(array, 4) == &array->data[3]);
	assert(aspa_array_search(array, 5) == &array->data[4]);

	aspa_array_free(array, true);
}